

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  XXH64_hash_t XVar5;
  ulong uVar6;
  ulong uVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  size_t err_code_2;
  size_t sVar11;
  code *pcVar12;
  xxh_u64 xVar13;
  ulong uVar14;
  BYTE *pBVar15;
  uint *puVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  size_t err_code_1;
  ulong uVar20;
  bool bVar21;
  BYTE *op;
  ulong local_d0;
  ulong local_b8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6b4d,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  sVar11 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  iVar10 = 0x18a8a7;
  sVar11 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
  if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
    iVar10 = 0x18a8cf;
    XXH_INLINE_XXH64_update(&cctx->xxhState,src,srcSize);
  }
  local_48 = 0;
  uStack_40 = 0;
  ZVar2 = (cctx->appliedParams).blockDelimiters;
  if (ZSTD_sf_explicitBlockDelimiters < ZVar2) {
    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6a88,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
  }
  if ((ZVar2 & ZSTD_sf_explicitBlockDelimiters) == ZSTD_sf_noBlockDelimiters) {
    pcVar12 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  }
  else {
    pcVar12 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  }
  pBVar15 = (BYTE *)((long)dst + sVar11);
  uVar20 = dstCapacity - sVar11;
  op = pBVar15;
  local_d0 = uVar20;
  if (srcSize == 0) {
    if (uVar20 < 4) {
      uVar17 = 0;
    }
    else {
      pBVar15[0] = '\x01';
      pBVar15[1] = '\0';
      pBVar15[2] = '\0';
      pBVar15[3] = '\0';
      uVar17 = 3;
      op = pBVar15 + 3;
      local_d0 = uVar20 - 3;
    }
    local_b8 = 0xffffffffffffffba;
    if (uVar20 < 4) goto LAB_0018adf0;
  }
  else {
    uVar17 = 0;
  }
  local_b8 = uVar17;
  if (srcSize == 0) {
LAB_0018adf0:
    sVar19 = local_b8;
    if ((local_b8 < 0xffffffffffffff89) &&
       (sVar11 = sVar11 + local_b8, sVar19 = sVar11, (cctx->appliedParams).fParams.checksumFlag != 0
       )) {
      uVar17 = (cctx->xxhState).total_len;
      if (uVar17 < 0x20) {
        lVar18 = (cctx->xxhState).v[2] + 0x27d4eb2f165667c5;
      }
      else {
        XVar5 = (cctx->xxhState).v[0];
        uVar14 = (cctx->xxhState).v[1];
        uVar6 = (cctx->xxhState).v[2];
        uVar7 = (cctx->xxhState).v[3];
        pBVar15 = (BYTE *)(((uVar14 * -0x6c158a5880000000 | uVar14 * -0x3d4d51c2d82b14b1 >> 0x21) *
                            -0x61c8864e7a143579 ^
                           ((XVar5 * -0x6c158a5880000000 | XVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
                            -0x61c8864e7a143579 ^
                           (uVar7 << 0x12 | uVar7 >> 0x2e) + (uVar6 << 0xc | uVar6 >> 0x34) +
                           (uVar14 << 7 | uVar14 >> 0x39) + (XVar5 << 1 | (ulong)((long)XVar5 < 0)))
                           * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                          -0x7a1435883d4d519d);
        lVar18 = ((uVar7 * -0x6c158a5880000000 | uVar7 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((uVar6 * -0x6c158a5880000000 | uVar6 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^ (ulong)pBVar15) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63)
                 * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      }
      xVar13 = XXH64_finalize(lVar18 + uVar17,(xxh_u8 *)(cctx->xxhState).mem64,uVar17,
                              (XXH_alignment)pBVar15);
      sVar19 = 0xffffffffffffffba;
      if (3 < uVar20 - local_b8) {
        *(int *)((long)dst + sVar11) = (int)xVar13;
        sVar19 = sVar11 + 4;
      }
    }
    return sVar19;
  }
  puVar16 = &inSeqs->matchLength;
  uVar20 = cctx->blockSize;
  if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
    uVar17 = uVar20;
    if (srcSize < uVar20) {
      uVar17 = srcSize;
    }
  }
  else {
    uVar14 = 0xffffffffffffff95;
    if (inSeqsSize != 0) {
      uVar17 = 0;
      sVar11 = inSeqsSize;
      do {
        uVar17 = (puVar16[-1] + *puVar16) + uVar17;
        if (((ZSTD_Sequence *)(puVar16 + -2))->offset == 0) {
          uVar14 = uVar17;
          if (*puVar16 != 0) {
            uVar14 = 0xffffffffffffff95;
          }
          break;
        }
        puVar16 = puVar16 + 4;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
    }
    uVar17 = uVar14;
    if (((uVar14 < 0xffffffffffffff89) && (uVar17 = 0xffffffffffffff95, uVar14 <= uVar20)) &&
       (uVar17 = uVar14, srcSize < uVar14)) {
      uVar17 = 0xffffffffffffff95;
    }
  }
  uVar9 = 1;
  if (0xffffffffffffff88 < uVar17) goto LAB_0018acf4;
  if (srcSize < uVar17) {
    __assert_fail("blockSize <= remaining",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6aec,
                  "size_t ZSTD_compressSequences_internal(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  (cctx->seqStore).lit = (cctx->seqStore).litStart;
  (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
  (cctx->seqStore).longLengthType = ZSTD_llt_none;
  uVar20 = (*pcVar12)(cctx,&local_48,inSeqs,inSeqsSize,src,uVar17,
                      (cctx->appliedParams).searchForExternalRepcodes);
  if (uVar20 < 0xffffffffffffff89) {
    uVar14 = uVar17 - uVar20;
    sVar8 = (short)uVar14;
    if (uVar14 < 7) {
      uVar20 = 0xffffffffffffffba;
      if (uVar14 + 3 <= local_d0) {
        *(ushort *)op = (ushort)(uVar17 == srcSize) + sVar8 * 8;
        op[2] = '\0';
        memcpy(op + 3,src,uVar14);
        uVar20 = uVar14 + 3;
      }
      if (uVar20 < 0xffffffffffffff89) {
        sVar11 = (*(code *)&LAB_0018acff)();
        return sVar11;
      }
    }
    else if (local_d0 < 3) {
      uVar20 = 0xffffffffffffffba;
    }
    else {
      uVar20 = ZSTD_entropyCompressSeqStore
                         (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                          &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,op + 3,
                          local_d0 - 3,uVar14,cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,iVar10)
      ;
      if (uVar20 < 0xffffffffffffff89) {
        if (((cctx->isFirstBlock == 0) &&
            ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
             0x20)) &&
           (((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10 &&
            (iVar10 = ZSTD_isRLE((BYTE *)src,uVar14), iVar10 != 0)))) {
          uVar20 = 1;
        }
        if (uVar20 == 1) {
          if (local_d0 != 3) {
            BVar1 = *src;
            *(ushort *)op = (uVar17 == srcSize) + 2 + sVar8 * 8;
            op[2] = (BYTE)(uVar14 >> 0xd);
            op[3] = BVar1;
          }
          uVar20 = 0xffffffffffffffba;
          if (local_d0 == 3) goto LAB_0018acef;
        }
        else if (uVar20 == 0) {
          uVar20 = 0xffffffffffffffba;
          if (uVar14 + 3 <= local_d0) {
            *(ushort *)op = (ushort)(uVar17 == srcSize) + sVar8 * 8;
            op[2] = (BYTE)(uVar14 >> 0xd);
            memcpy(op + 3,src,uVar14);
            uVar20 = uVar14 + 3;
          }
          if (0xffffffffffffff88 < uVar20) goto LAB_0018acef;
        }
        else {
          pZVar3 = (cctx->blockState).prevCBlock;
          pZVar4 = (cctx->blockState).nextCBlock;
          (cctx->blockState).prevCBlock = pZVar4;
          (cctx->blockState).nextCBlock = pZVar3;
          if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
            (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
          }
          *(ushort *)op = (uVar17 == srcSize) + 4 + (short)uVar20 * 8;
          op[2] = (BYTE)(uVar20 >> 0xd);
        }
        uVar9 = 3;
        bVar21 = uVar17 != srcSize;
        uVar17 = 0xffffffffffffffba;
        if (bVar21) {
          cctx->isFirstBlock = 0;
          uVar9 = 0;
        }
        goto LAB_0018acf4;
      }
    }
  }
LAB_0018acef:
  uVar9 = 1;
  uVar17 = uVar20;
LAB_0018acf4:
  sVar11 = (*(code *)((long)&DAT_00300680 + (long)(int)(&DAT_00300680)[uVar9]))(uVar17);
  return sVar11;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}